

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void Util::writeXmlElement<HorizontalAlignment>
               (stringstream *str,int indent,string *name,HorizontalAlignment value)

{
  ostream *poVar1;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  getIndent_abi_cxx11_(0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(str + 0x10),local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

static void writeXmlElement(std::stringstream &str, int indent, std::string name, T value)
	{
		str << getIndent(indent) << "<" << name << ">" << value << "</" << name << ">" << std::endl;
	}